

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O2

int luaZ_fill(ZIO *z)

{
  int iVar1;
  lua_State *plVar2;
  int *piVar3;
  uint uVar4;
  size_t in_RAX;
  byte *pbVar5;
  char *__assertion;
  size_t size;
  
  plVar2 = z->L;
  piVar3 = *(int **)&plVar2[-1].hookmask;
  *piVar3 = *piVar3 + -1;
  if (*piVar3 == 0) {
    size = in_RAX;
    pbVar5 = (byte *)(*z->reader)(plVar2,z->data,&size);
    iVar1 = **(int **)&plVar2[-1].hookmask;
    **(int **)&plVar2[-1].hookmask = iVar1 + 1;
    if (iVar1 == 0) {
      if (size == 0 || pbVar5 == (byte *)0x0) {
        uVar4 = 0xffffffff;
      }
      else {
        z->n = size - 1;
        z->p = (char *)(pbVar5 + 1);
        uVar4 = (uint)*pbVar5;
      }
      return uVar4;
    }
    __assertion = 
    "(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0";
    uVar4 = 0x1d;
  }
  else {
    __assertion = 
    "--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0";
    uVar4 = 0x1b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lzio.c"
                ,uVar4,"int luaZ_fill(ZIO *)");
}

Assistant:

int luaZ_fill (ZIO *z) {
  size_t size;
  lua_State *L = z->L;
  const char *buff;
  lua_unlock(L);
  buff = z->reader(L, z->data, &size);
  lua_lock(L);
  if (buff == NULL || size == 0)
    return EOZ;
  z->n = size - 1;  /* discount char being returned */
  z->p = buff;
  return cast_uchar(*(z->p++));
}